

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O2

bool __thiscall
Assimp::LWOImporter::CanRead(LWOImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  bool bVar2;
  string extension;
  uint32_t tokens [3];
  
  BaseImporter::GetExtension(&extension,pFile);
  bVar1 = std::operator==(&extension,"lwo");
  bVar2 = true;
  if (!bVar1) {
    bVar1 = std::operator==(&extension,"lxo");
    if (!bVar1) {
      if (extension._M_string_length == 0 || checkSig) {
        tokens[0] = 0x4c574f42;
        tokens[1] = 0x4c574f32;
        tokens[2] = 0x4c584f42;
        bVar2 = BaseImporter::CheckMagicToken(pIOHandler,pFile,tokens,3,8,4);
      }
      else {
        bVar2 = false;
      }
    }
  }
  std::__cxx11::string::~string((string *)&extension);
  return bVar2;
}

Assistant:

bool LWOImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    const std::string extension = GetExtension(pFile);
    if (extension == "lwo" || extension == "lxo") {
        return true;
    }

    // if check for extension is not enough, check for the magic tokens
    if (!extension.length() || checkSig) {
        uint32_t tokens[3];
        tokens[0] = AI_LWO_FOURCC_LWOB;
        tokens[1] = AI_LWO_FOURCC_LWO2;
        tokens[2] = AI_LWO_FOURCC_LXOB;
        return CheckMagicToken(pIOHandler,pFile,tokens,3,8);
    }
    return false;
}